

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

Uint32 __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::CountFunctionArguments
          (ConversionStream *this,iterator *Token,iterator *ScopeEnd)

{
  int iVar1;
  undefined8 in_RAX;
  _List_node_base *p_Var2;
  char (*in_RCX) [36];
  TokenListType *Args_1;
  Uint32 UVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  int iVar6;
  int iVar7;
  string msg;
  string local_80;
  undefined4 local_5c;
  String local_58;
  ConversionStream *local_38;
  
  p_Var2 = Token->_M_node;
  if (*(int *)&p_Var2[1]._M_next == 0x135) {
    p_Var4 = ScopeEnd->_M_node;
LAB_002cbf01:
    p_Var2 = p_Var2->_M_next;
    Token->_M_node = p_Var2;
    iVar7 = 1;
    local_5c = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  }
  else {
    FormatString<char[26],char[36]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::OpenParen",in_RCX);
    in_RCX = (char (*) [36])0x68a;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x68a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = Token->_M_node;
    in_RAX = 0;
    local_5c = 0;
    p_Var4 = ScopeEnd->_M_node;
    iVar7 = 0;
    if (*(int *)&p_Var2[1]._M_next == 0x135) goto LAB_002cbf01;
  }
  if (p_Var2 == p_Var4) {
    UVar3 = 0;
    p_Var5 = p_Var4;
    iVar6 = iVar7;
  }
  else {
    UVar3 = 0;
    iVar1 = iVar7;
    local_38 = this;
    do {
      if (*(int *)&p_Var2[1]._M_next == 0x136) {
        iVar6 = iVar1 + -1;
        p_Var5 = p_Var2;
        this = local_38;
        if (iVar1 <= iVar7) break;
      }
      else {
        iVar6 = iVar1;
        if (*(int *)&p_Var2[1]._M_next == 0x135) {
          iVar6 = iVar1 + 1;
        }
      }
      UVar3 = UVar3 + (UVar3 == 0);
      if (iVar6 == 1) {
        iVar1 = std::__cxx11::string::compare((char *)&p_Var2[1]._M_prev);
        UVar3 = UVar3 + (iVar1 == 0);
        p_Var2 = Token->_M_node;
      }
      p_Var2 = p_Var2->_M_next;
      Token->_M_node = p_Var2;
      p_Var5 = p_Var4;
      this = local_38;
      iVar1 = iVar6;
    } while (p_Var2 != p_Var4);
  }
  if ((char)local_5c == '\0') {
    if (iVar6 == 0) goto LAB_002cc106;
    FormatString<char[20]>(&local_80,(char (*) [20])"Unbalanced brackets");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_58,this,Token,4)
    ;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd23,&local_80,(char (*) [2])0x6d28c5,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (p_Var5 == (_List_node_base *)&this->m_Tokens) {
      FormatString<char[38]>(&local_80,(char (*) [38])"Unexpected EOF while processing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_58,this,Token,4);
      in_RCX = (char (*) [36])0xd1e;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1e,&local_80,(char (*) [2])0x6d28c5,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = Token->_M_node;
    }
    if (*(int *)&p_Var2[1]._M_next == 0x136) goto LAB_002cc106;
    FormatString<char[26],char[32]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == ClosingParenType",(char (*) [32])in_RCX);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd1f);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
LAB_002cc106:
  Args_1 = &this->m_Tokens;
  p_Var2 = Token->_M_node;
  if (p_Var2 == (_List_node_base *)Args_1) {
    FormatString<char[46]>(&local_80,(char (*) [46])"Unexpected EOF while processing argument list")
    ;
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_58,this,Token,4)
    ;
    Args_1 = (TokenListType *)0x6a0;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6a0,&local_80,(char (*) [2])0x6d28c5,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = Token->_M_node;
  }
  if (*(int *)&p_Var2[1]._M_next != 0x136) {
    FormatString<char[26],char[39]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::ClosingParen",(char (*) [39])Args_1);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6a1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = Token->_M_node;
  }
  Token->_M_node = p_Var2->_M_next;
  return UVar3;
}

Assistant:

Uint32 HLSL2GLSLConverterImpl::ConversionStream::CountFunctionArguments(TokenListType::iterator& Token, const TokenListType::iterator& ScopeEnd)
{
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                ^
    VERIFY_EXPR(Token->Type == TokenType::OpenParen);
    Uint32 NumArguments = 0;
    ProcessScope(
        Token, ScopeEnd, TokenType::OpenParen, TokenType::ClosingParen,
        [&](TokenListType::iterator& tkn, int ScopeDepth) {
            // Argument list is not empty, so there is at least one argument.
            if (NumArguments == 0)
                NumArguments = 1;
            // Number of additional arguments equals the number of commas
            // in scope depth 1

            // Do not count arguments of nested functions:
            // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
            //                                          ^
            //                                        ScopeDepth == 2
            if (ScopeDepth == 1 && tkn->Literal == ",")
                ++NumArguments;
            ++tkn;
        } //
    );
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                      ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while processing argument list");
    VERIFY_EXPR(Token->Type == TokenType::ClosingParen);
    ++Token;
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                       ^
    return NumArguments;
}